

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O3

lua_Number numarith(CompilerState *compiler_state,int op,lua_Number v1,lua_Number v2)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = v1;
  auVar4._8_8_ = in_register_00001208._0_8_;
  switch((ulong)compiler_state & 0xffffffff) {
  case 0:
    dVar5 = v1 + v2;
    break;
  case 1:
    dVar5 = v1 - v2;
    break;
  case 2:
    dVar5 = v1 * v2;
    break;
  case 3:
    dVar5 = fmod(v1,v2);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar5 * v2;
    uVar1 = vcmpsd_avx512f(auVar7,ZEXT816(0) << 0x40,1);
    bVar2 = (bool)((byte)uVar1 & 1);
    dVar5 = (double)((ulong)bVar2 * (long)(dVar5 + v2) + (ulong)!bVar2 * (long)dVar5);
    break;
  case 4:
    dVar5 = pow(v1,v2);
    return dVar5;
  case 5:
    dVar5 = v1 / v2;
    break;
  case 6:
    auVar4._0_8_ = v1 / v2;
    auVar4 = vroundsd_avx(auVar4,auVar4,9);
    dVar5 = auVar4._0_8_;
    break;
  default:
    if ((int)compiler_state != 0x16) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_simplify.c"
                    ,0x123,"lua_Number numarith(CompilerState *, int, lua_Number, lua_Number)");
    }
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar4 = vxorpd_avx512vl(auVar6._0_16_,auVar3);
    dVar5 = auVar4._0_8_;
  }
  return dVar5;
}

Assistant:

static lua_Number numarith(CompilerState *compiler_state, int op, lua_Number v1, lua_Number v2)
{
	switch (op) {
	case BINOPR_ADD:
		return luai_numadd(v1, v2);
	case BINOPR_SUB:
		return luai_numsub(v1, v2);
	case BINOPR_MUL:
		return luai_nummul(v1, v2);
	case BINOPR_DIV:
		return luai_numdiv(v1, v2);
	case BINOPR_POW:
		return luai_numpow(v1, v2);
	case BINOPR_IDIV:
		return luai_numidiv(v1, v2);
	case UNOPR_MINUS:
		return luai_numunm(v1);
	case BINOPR_MOD:
		return luaV_modf(v1, v2);
	default:
		assert(0);
		return 0;
	}
}